

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

bool __thiscall Uniforms::haveChange(Uniforms *this)

{
  UniformFunctionsMap *this_00;
  bool bVar1;
  Camera *pCVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  key_type local_a0;
  key_type local_80;
  key_type local_60;
  key_type local_40;
  
  pCVar2 = (this->super_Scene).activeCamera;
  if ((pCVar2 == (Camera *)0x0) || ((pCVar2->super_Node).bChange == false)) {
    this_00 = &this->functions;
    std::__cxx11::string::string((string *)&local_80,"u_time",&local_a1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
             ::operator[](this_00,&local_80);
    if (pmVar3->present == false) {
      std::__cxx11::string::string((string *)&local_a0,"u_date",&local_a2);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
               ::operator[](this_00,&local_a0);
      if (pmVar3->present == false) {
        std::__cxx11::string::string((string *)&local_60,"u_delta",&local_a3);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                 ::operator[](this_00,&local_60);
        if (pmVar3->present == false) {
          std::__cxx11::string::string((string *)&local_40,"u_mouse",&local_a4);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                   ::operator[](this_00,&local_40);
          bVar1 = pmVar3->present;
          std::__cxx11::string::~string((string *)&local_40);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
          if (bVar1 != false) {
            return true;
          }
          for (p_Var4 = (this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var4 !=
              &(this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            if (*(char *)(*(long *)(p_Var4 + 2) + 0x20) != '\0') {
              return true;
            }
          }
          if (this->m_change != false) {
            return true;
          }
          return (this->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
        }
        std::__cxx11::string::~string((string *)&local_60);
      }
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  return true;
}

Assistant:

bool Uniforms::haveChange() { 
    if (activeCamera)
        if (activeCamera->bChange)
            return true;
            
    if (functions["u_time"].present || 
        functions["u_date"].present ||
        functions["u_delta"].present ||
        functions["u_mouse"].present)
        return true;

    for (vera::LightsMap::const_iterator it = lights.begin(); it != lights.end(); ++it)
        if (it->second->bChange)
            return true;

    if (m_change || streams.size() > 0)
        return true;

    return false;
}